

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

void write2file(string *output,double *p_value_dp,double *p_value_poisbinom,double *p_value_hypergeo
               ,int m)

{
  byte bVar1;
  ostream *poVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_R8D;
  int k;
  ofstream myfile;
  int local_238;
  ostream local_228 [516];
  int local_24;
  long local_20;
  long local_18;
  long local_10;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ofstream::ofstream();
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Unable to open file");
  }
  else {
    poVar2 = std::operator<<(local_228,"k");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"DP");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"PB");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"HG");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_238 = 0; local_238 <= local_24; local_238 = local_238 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(local_228,local_238);
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,*(double *)(local_10 + (long)local_238 * 8));
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,*(double *)(local_18 + (long)local_238 * 8));
      poVar2 = std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,*(double *)(local_20 + (long)local_238 * 8));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void write2file(string output, double* p_value_dp, double* p_value_poisbinom, double* p_value_hypergeo, int m)
{
    ofstream myfile (output);
    if (myfile.is_open()) {
        myfile << "k" << "\t" << "DP" << "\t" << "PB" << "\t" << "HG" <<endl;
        for(int k=0; k<=m; k++){
            myfile << k << "\t" << p_value_dp[k] << "\t" << p_value_poisbinom[k] << "\t" << p_value_hypergeo[k] <<endl;
        }
        myfile.close();
        }
    else cout << "Unable to open file";
}